

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XLinkStream.cpp
# Opt level: O3

ssize_t __thiscall dai::XLinkStream::read(XLinkStream *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  
  (this->connection).super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->connection).super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->streamName)._M_dataplus._M_p = (pointer)0x0;
  read((XLinkStream *)CONCAT44(in_register_00000034,__fd),(int)this,__buf,__nbytes);
  return (ssize_t)this;
}

Assistant:

std::vector<std::uint8_t> XLinkStream::read() {
    std::vector<std::uint8_t> data;
    read(data);
    return data;
}